

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O1

void re2::SearchPCRE(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  bool bVar1;
  int iVar2;
  PCRE re;
  LogMessage local_1b0;
  
  if (0 < iters) {
    do {
      PCRE::PCRE(&re,regexp,EnabledCompileOptions);
      iVar2 = std::__cxx11::string::compare((char *)re.error_);
      if (iVar2 != 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3ab,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"Check failed: (re.error()) == (\"\")",0x22);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      if (anchor == kAnchored) {
        bVar1 = PCRE::FullMatchFunctor::operator()
                          ((FullMatchFunctor *)&PCRE::FullMatch,text,&re,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args);
        if (bVar1 != expect_match) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                     ,0x3ad,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,
                     "Check failed: (PCRE::FullMatch(text, re)) == (expect_match)",0x3b);
LAB_00121b9a:
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
      }
      else {
        bVar1 = PCRE::PartialMatchFunctor::operator()
                          ((PartialMatchFunctor *)&PCRE::PartialMatch,text,&re,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
        if (bVar1 != expect_match) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                     ,0x3af,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,
                     "Check failed: (PCRE::PartialMatch(text, re)) == (expect_match)",0x3e);
          goto LAB_00121b9a;
        }
      }
      PCRE::~PCRE(&re);
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

void SearchPCRE(int iters, const char* regexp, const StringPiece& text,
                Prog::Anchor anchor, bool expect_match) {
  for (int i = 0; i < iters; i++) {
    PCRE re(regexp, PCRE::UTF8);
    CHECK_EQ(re.error(), "");
    if (anchor == Prog::kAnchored)
      CHECK_EQ(PCRE::FullMatch(text, re), expect_match);
    else
      CHECK_EQ(PCRE::PartialMatch(text, re), expect_match);
  }
}